

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O3

SQInteger __thiscall SQBlob::Write(SQBlob *this,void *buffer,SQInteger size)

{
  long n;
  long lVar1;
  
  lVar1 = this->_ptr;
  n = (lVar1 + size) - this->_size;
  if (n != 0 && this->_size <= lVar1 + size) {
    GrowBufOf(this,n);
    lVar1 = this->_ptr;
  }
  memcpy(this->_buf + lVar1,buffer,size);
  this->_ptr = this->_ptr + size;
  return size;
}

Assistant:

SQInteger Write(void *buffer, SQInteger size) {
        if(!CanAdvance(size)) {
            GrowBufOf(_ptr + size - _size);
        }
        memcpy(&_buf[_ptr], buffer, size);
        _ptr += size;
        return size;
    }